

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O1

void dradfg(int ido,int ip,int l1,int idl1,float *cc,float *c1,float *c2,float *ch,float *ch2,
           float *wa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  float *pfVar17;
  int iVar18;
  int iVar19;
  float *pfVar20;
  int iVar21;
  double dVar22;
  double dVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  int local_64;
  int local_50;
  int local_4c;
  
  dVar22 = cos((double)(6.2831855 / (float)ip));
  dVar23 = sin((double)(6.2831855 / (float)ip));
  iVar1 = ip + 1 >> 1;
  iVar2 = ido + -1 >> 1;
  iVar3 = l1 * ido;
  if (ido != 1) {
    if (0 < idl1) {
      uVar9 = 0;
      do {
        ch2[uVar9] = c2[uVar9];
        uVar9 = uVar9 + 1;
      } while ((uint)idl1 != uVar9);
    }
    if (1 < ip) {
      iVar10 = 1;
      iVar4 = iVar3;
      do {
        if (0 < l1) {
          lVar12 = (long)iVar4 << 2;
          iVar13 = l1;
          do {
            *(undefined4 *)((long)ch + lVar12) = *(undefined4 *)((long)c1 + lVar12);
            lVar12 = lVar12 + (long)ido * 4;
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
        }
        iVar10 = iVar10 + 1;
        iVar4 = iVar4 + iVar3;
      } while (iVar10 != ip);
    }
    if (l1 < iVar2) {
      if (1 < ip) {
        iVar10 = 1;
        iVar13 = -1;
        iVar4 = iVar3;
        do {
          if (0 < l1) {
            iVar21 = 0;
            iVar18 = iVar4;
            do {
              if (2 < ido) {
                lVar12 = 2;
                do {
                  ch[(long)iVar18 + lVar12 + -1] =
                       wa[(long)iVar13 + lVar12 + -1] * c1[(long)iVar18 + lVar12 + -1] +
                       wa[iVar13 + lVar12] * c1[iVar18 + lVar12];
                  ch[iVar18 + lVar12] =
                       wa[(long)iVar13 + lVar12 + -1] * c1[iVar18 + lVar12] -
                       c1[(long)iVar18 + lVar12 + -1] * wa[iVar13 + lVar12];
                  lVar12 = lVar12 + 2;
                } while ((int)lVar12 < ido);
              }
              iVar21 = iVar21 + 1;
              iVar18 = iVar18 + ido;
            } while (iVar21 != l1);
          }
          iVar10 = iVar10 + 1;
          iVar13 = iVar13 + ido;
          iVar4 = iVar4 + iVar3;
        } while (iVar10 != ip);
      }
    }
    else if (1 < ip) {
      iVar4 = iVar3 + 2;
      iVar10 = 1;
      iVar13 = -1;
      do {
        if (2 < ido) {
          iVar21 = 2;
          lVar12 = (long)iVar13;
          iVar18 = iVar4;
          do {
            lVar15 = lVar12 + 2;
            if (0 < l1) {
              lVar16 = (long)iVar18 << 2;
              iVar7 = l1;
              do {
                *(float *)((long)ch + lVar16 + -4) =
                     wa[lVar12 + 1] * *(float *)((long)c1 + lVar16 + -4) +
                     wa[lVar15] * *(float *)((long)c1 + lVar16);
                *(float *)((long)ch + lVar16) =
                     wa[lVar12 + 1] * *(float *)((long)c1 + lVar16) -
                     *(float *)((long)c1 + lVar16 + -4) * wa[lVar15];
                lVar16 = lVar16 + (long)ido * 4;
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
            }
            iVar21 = iVar21 + 2;
            iVar18 = iVar18 + 2;
            lVar12 = lVar15;
          } while (iVar21 < ido);
        }
        iVar10 = iVar10 + 1;
        iVar4 = iVar4 + iVar3;
        iVar13 = iVar13 + ido;
      } while (iVar10 != ip);
    }
    if (iVar2 < l1) {
      if (1 < iVar1) {
        iVar4 = ((ip + -1) * l1 + -1) * ido + 2;
        lVar12 = (long)ido;
        local_64 = (l1 + -1) * ido + 2;
        iVar10 = 1;
        do {
          if (2 < ido) {
            iVar21 = 2;
            iVar13 = iVar4;
            iVar18 = local_64;
            do {
              if (0 < l1) {
                lVar15 = iVar18 + lVar12;
                lVar16 = iVar13 + lVar12;
                lVar14 = 0;
                iVar7 = l1;
                do {
                  *(float *)((long)c1 + lVar14 + lVar15 * 4 + -4) =
                       *(float *)((long)ch + lVar14 + lVar15 * 4 + -4) +
                       *(float *)((long)ch + lVar14 + lVar16 * 4 + -4);
                  *(float *)((long)c1 + lVar14 + lVar16 * 4 + -4) =
                       *(float *)((long)ch + lVar14 + lVar15 * 4) -
                       *(float *)((long)ch + lVar14 + lVar16 * 4);
                  *(float *)((long)c1 + lVar14 + lVar15 * 4) =
                       *(float *)((long)ch + lVar14 + lVar15 * 4) +
                       *(float *)((long)ch + lVar14 + lVar16 * 4);
                  *(float *)((long)c1 + lVar14 + lVar16 * 4) =
                       *(float *)((long)ch + lVar14 + lVar16 * 4 + -4) -
                       *(float *)((long)ch + lVar14 + lVar15 * 4 + -4);
                  lVar14 = lVar14 + lVar12 * 4;
                  iVar7 = iVar7 + -1;
                } while (iVar7 != 0);
              }
              iVar21 = iVar21 + 2;
              iVar13 = iVar13 + 2;
              iVar18 = iVar18 + 2;
            } while (iVar21 < ido);
          }
          iVar10 = iVar10 + 1;
          iVar4 = iVar4 - iVar3;
          local_64 = local_64 + iVar3;
        } while (iVar10 != iVar1);
      }
    }
    else if (1 < iVar1) {
      iVar10 = (ip + -1) * l1 * ido;
      iVar13 = 1;
      iVar4 = iVar3;
      do {
        if (0 < l1) {
          pfVar6 = ch + (long)iVar4 + 2;
          pfVar5 = c1 + (long)iVar4 + 2;
          pfVar17 = ch + (long)iVar10 + 2;
          pfVar20 = c1 + (long)iVar10 + 2;
          iVar18 = 0;
          do {
            if (2 < ido) {
              lVar12 = 0;
              do {
                pfVar5[lVar12 + -1] = pfVar6[lVar12 + -1] + pfVar17[lVar12 + -1];
                pfVar20[lVar12 + -1] = pfVar6[lVar12] - pfVar17[lVar12];
                pfVar5[lVar12] = pfVar6[lVar12] + pfVar17[lVar12];
                pfVar20[lVar12] = pfVar17[lVar12 + -1] - pfVar6[lVar12 + -1];
                iVar21 = (int)lVar12;
                lVar12 = lVar12 + 2;
              } while (iVar21 + 4 < ido);
            }
            iVar18 = iVar18 + 1;
            pfVar6 = pfVar6 + ido;
            pfVar5 = pfVar5 + ido;
            pfVar17 = pfVar17 + ido;
            pfVar20 = pfVar20 + ido;
          } while (iVar18 != l1);
        }
        iVar13 = iVar13 + 1;
        iVar10 = iVar10 - iVar3;
        iVar4 = iVar4 + iVar3;
      } while (iVar13 != iVar1);
    }
  }
  if (0 < idl1) {
    uVar9 = 0;
    do {
      c2[uVar9] = ch2[uVar9];
      uVar9 = uVar9 + 1;
    } while ((uint)idl1 != uVar9);
  }
  if (1 < iVar1) {
    iVar4 = (l1 + -1) * ido;
    iVar10 = ~l1 * ido + idl1 * ip;
    iVar13 = 1;
    do {
      if (0 < l1) {
        lVar15 = (long)iVar10;
        lVar16 = (long)iVar4;
        lVar12 = (long)ido * 4;
        iVar18 = l1;
        do {
          *(float *)((long)c1 + lVar12 + lVar16 * 4) =
               *(float *)((long)ch + lVar12 + lVar16 * 4) +
               *(float *)((long)ch + lVar12 + lVar15 * 4);
          *(float *)((long)c1 + lVar12 + lVar15 * 4) =
               *(float *)((long)ch + lVar12 + lVar15 * 4) -
               *(float *)((long)ch + lVar12 + lVar16 * 4);
          lVar12 = lVar12 + (long)ido * 4;
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
      }
      iVar13 = iVar13 + 1;
      iVar4 = iVar4 + iVar3;
      iVar10 = iVar10 - iVar3;
    } while (iVar13 != iVar1);
  }
  local_64 = ip + -1;
  if (1 < iVar1) {
    iVar13 = local_64 * idl1;
    lVar12 = (long)iVar13;
    fVar24 = 0.0;
    iVar10 = 1;
    fVar26 = 1.0;
    iVar4 = idl1;
    do {
      fVar25 = (float)dVar22 * fVar26 - (float)dVar23 * fVar24;
      fVar24 = fVar24 * (float)dVar22 + fVar26 * (float)dVar23;
      if (0 < idl1) {
        uVar9 = 0;
        do {
          ch2[(long)iVar4 + uVar9] = c2[(long)idl1 + uVar9] * fVar25 + c2[uVar9];
          ch2[(long)iVar13 + uVar9] = c2[lVar12 + uVar9] * fVar24;
          uVar9 = uVar9 + 1;
        } while ((uint)idl1 != uVar9);
      }
      if (iVar1 != 2) {
        iVar7 = 2;
        fVar26 = fVar24;
        fVar27 = fVar25;
        iVar18 = idl1 * 2;
        iVar21 = (ip + -2) * idl1;
        do {
          fVar28 = fVar25 * fVar27 + fVar26 * -fVar24;
          fVar26 = fVar27 * fVar24 + fVar25 * fVar26;
          if (0 < idl1) {
            lVar15 = 0;
            do {
              ch2[iVar4 + lVar15] = c2[iVar18 + lVar15] * fVar28 + ch2[iVar4 + lVar15];
              ch2[iVar13 + lVar15] = c2[iVar21 + lVar15] * fVar26 + ch2[iVar13 + lVar15];
              lVar15 = lVar15 + 1;
            } while (idl1 != (int)lVar15);
          }
          iVar7 = iVar7 + 1;
          iVar21 = iVar21 - idl1;
          iVar18 = iVar18 + idl1;
          fVar27 = fVar28;
        } while (iVar7 != iVar1);
      }
      iVar10 = iVar10 + 1;
      iVar4 = iVar4 + idl1;
      iVar13 = iVar13 - idl1;
      fVar26 = fVar25;
    } while (iVar10 != iVar1);
  }
  if (1 < iVar1) {
    iVar10 = 1;
    iVar4 = idl1;
    do {
      if (0 < idl1) {
        uVar9 = 0;
        do {
          ch2[uVar9] = c2[(long)iVar4 + uVar9] + ch2[uVar9];
          uVar9 = uVar9 + 1;
        } while ((uint)idl1 != uVar9);
      }
      iVar10 = iVar10 + 1;
      iVar4 = iVar4 + idl1;
    } while (iVar10 != iVar1);
  }
  iVar4 = ip * ido;
  if (ido < l1) {
    if (0 < ido) {
      uVar9 = 0;
      pfVar6 = ch;
      pfVar5 = cc;
      do {
        pfVar17 = pfVar6;
        pfVar20 = pfVar5;
        iVar10 = l1;
        if (0 < l1) {
          do {
            *pfVar20 = *pfVar17;
            iVar10 = iVar10 + -1;
            pfVar17 = pfVar17 + (uint)ido;
            pfVar20 = pfVar20 + iVar4;
          } while (iVar10 != 0);
        }
        uVar9 = uVar9 + 1;
        pfVar5 = pfVar5 + 1;
        pfVar6 = pfVar6 + 1;
      } while (uVar9 != (uint)ido);
    }
  }
  else if (0 < l1) {
    iVar10 = 0;
    pfVar6 = ch;
    pfVar5 = cc;
    do {
      if (0 < ido) {
        lVar12 = 0;
        do {
          pfVar5[lVar12] = pfVar6[lVar12];
          lVar12 = lVar12 + 1;
        } while (ido != (int)lVar12);
      }
      iVar10 = iVar10 + 1;
      pfVar5 = pfVar5 + iVar4;
      pfVar6 = pfVar6 + ido;
    } while (iVar10 != l1);
  }
  iVar10 = ido * 2;
  if (1 < iVar1) {
    iVar21 = l1 * ido * local_64;
    iVar7 = 1;
    iVar13 = iVar3;
    iVar18 = iVar10;
    do {
      if (0 < l1) {
        pfVar6 = cc + iVar18;
        pfVar5 = ch;
        iVar11 = l1;
        do {
          pfVar6[-1] = pfVar5[iVar13];
          *pfVar6 = pfVar5[iVar21];
          pfVar6 = pfVar6 + iVar4;
          pfVar5 = pfVar5 + ido;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      iVar7 = iVar7 + 1;
      iVar21 = iVar21 - iVar3;
      iVar13 = iVar13 + iVar3;
      iVar18 = iVar18 + iVar10;
    } while (iVar7 != iVar1);
  }
  if (ido != 1) {
    if (iVar2 < l1) {
      if (1 < iVar1) {
        local_50 = local_64 * iVar3 + 2;
        local_64 = iVar3 + 2;
        iVar2 = iVar10 + 2;
        local_4c = iVar10 + -2;
        iVar13 = 1;
        do {
          if (2 < ido) {
            iVar8 = 2;
            iVar18 = local_4c;
            iVar21 = iVar2;
            iVar7 = local_64;
            iVar11 = local_50;
            do {
              if (0 < l1) {
                pfVar6 = cc;
                pfVar5 = ch;
                iVar19 = l1;
                do {
                  pfVar6[(long)iVar21 + -1] = pfVar5[(long)iVar7 + -1] + pfVar5[(long)iVar11 + -1];
                  pfVar6[(long)iVar18 + -1] = pfVar5[(long)iVar7 + -1] - pfVar5[(long)iVar11 + -1];
                  pfVar6[iVar21] = pfVar5[iVar7] + pfVar5[iVar11];
                  pfVar6[iVar18] = pfVar5[iVar11] - pfVar5[iVar7];
                  pfVar6 = pfVar6 + iVar4;
                  pfVar5 = pfVar5 + ido;
                  iVar19 = iVar19 + -1;
                } while (iVar19 != 0);
              }
              iVar8 = iVar8 + 2;
              iVar11 = iVar11 + 2;
              iVar7 = iVar7 + 2;
              iVar21 = iVar21 + 2;
              iVar18 = iVar18 + -2;
            } while (iVar8 < ido);
          }
          iVar13 = iVar13 + 1;
          local_50 = local_50 - iVar3;
          local_64 = local_64 + iVar3;
          iVar2 = iVar2 + iVar10;
          local_4c = local_4c + iVar10;
        } while (iVar13 != iVar1);
      }
    }
    else if (1 < iVar1) {
      lVar12 = (long)ido;
      local_64 = l1 * ido * local_64;
      iVar2 = iVar10 + -2;
      iVar21 = 1;
      iVar13 = iVar3;
      iVar18 = iVar10;
      do {
        if (0 < l1) {
          pfVar6 = cc + iVar18;
          pfVar5 = ch + local_64;
          pfVar17 = ch + iVar13;
          iVar11 = 0;
          iVar7 = iVar2;
          do {
            if (2 < ido) {
              lVar15 = 2;
              iVar8 = iVar7;
              do {
                pfVar6[lVar15 + -1] = pfVar17[lVar15 + -1] + pfVar5[lVar15 + -1];
                cc[(long)iVar8 + -1] = pfVar17[lVar15 + -1] - pfVar5[lVar15 + -1];
                pfVar6[lVar15] = pfVar17[lVar15] + pfVar5[lVar15];
                cc[iVar8] = pfVar5[lVar15] - pfVar17[lVar15];
                lVar15 = lVar15 + 2;
                iVar8 = iVar8 + -2;
              } while (lVar15 < lVar12);
            }
            iVar11 = iVar11 + 1;
            pfVar6 = pfVar6 + iVar4;
            pfVar5 = pfVar5 + lVar12;
            pfVar17 = pfVar17 + lVar12;
            iVar7 = iVar7 + iVar4;
          } while (iVar11 != l1);
        }
        iVar21 = iVar21 + 1;
        local_64 = local_64 - iVar3;
        iVar13 = iVar13 + iVar3;
        iVar18 = iVar18 + iVar10;
        iVar2 = iVar2 + iVar10;
      } while (iVar21 != iVar1);
    }
  }
  return;
}

Assistant:

static void dradfg(int ido,int ip,int l1,int idl1,float *cc,float *c1,
                          float *c2,float *ch,float *ch2,float *wa){

  static float tpi=6.283185307179586f;
  int idij,ipph,i,j,k,l,ic,ik,is;
  int t0,t1,t2,t3,t4,t5,t6,t7,t8,t9,t10;
  float dc2,ai1,ai2,ar1,ar2,ds2;
  int nbd;
  float dcp,arg,dsp,ar1h,ar2h;
  int idp2,ipp2;

  arg=tpi/(float)ip;
  dcp=cos(arg);
  dsp=sin(arg);
  ipph=(ip+1)>>1;
  ipp2=ip;
  idp2=ido;
  nbd=(ido-1)>>1;
  t0=l1*ido;
  t10=ip*ido;

  if(ido==1)goto L119;
  for(ik=0;ik<idl1;ik++)ch2[ik]=c2[ik];

  t1=0;
  for(j=1;j<ip;j++){
    t1+=t0;
    t2=t1;
    for(k=0;k<l1;k++){
      ch[t2]=c1[t2];
      t2+=ido;
    }
  }

  is=-ido;
  t1=0;
  if(nbd>l1){
    for(j=1;j<ip;j++){
      t1+=t0;
      is+=ido;
      t2= -ido+t1;
      for(k=0;k<l1;k++){
        idij=is-1;
        t2+=ido;
        t3=t2;
        for(i=2;i<ido;i+=2){
          idij+=2;
          t3+=2;
          ch[t3-1]=wa[idij-1]*c1[t3-1]+wa[idij]*c1[t3];
          ch[t3]=wa[idij-1]*c1[t3]-wa[idij]*c1[t3-1];
        }
      }
    }
  }else{

    for(j=1;j<ip;j++){
      is+=ido;
      idij=is-1;
      t1+=t0;
      t2=t1;
      for(i=2;i<ido;i+=2){
        idij+=2;
        t2+=2;
        t3=t2;
        for(k=0;k<l1;k++){
          ch[t3-1]=wa[idij-1]*c1[t3-1]+wa[idij]*c1[t3];
          ch[t3]=wa[idij-1]*c1[t3]-wa[idij]*c1[t3-1];
          t3+=ido;
        }
      }
    }
  }

  t1=0;
  t2=ipp2*t0;
  if(nbd<l1){
    for(j=1;j<ipph;j++){
      t1+=t0;
      t2-=t0;
      t3=t1;
      t4=t2;
      for(i=2;i<ido;i+=2){
        t3+=2;
        t4+=2;
        t5=t3-ido;
        t6=t4-ido;
        for(k=0;k<l1;k++){
          t5+=ido;
          t6+=ido;
          c1[t5-1]=ch[t5-1]+ch[t6-1];
          c1[t6-1]=ch[t5]-ch[t6];
          c1[t5]=ch[t5]+ch[t6];
          c1[t6]=ch[t6-1]-ch[t5-1];
        }
      }
    }
  }else{
    for(j=1;j<ipph;j++){
      t1+=t0;
      t2-=t0;
      t3=t1;
      t4=t2;
      for(k=0;k<l1;k++){
        t5=t3;
        t6=t4;
        for(i=2;i<ido;i+=2){
          t5+=2;
          t6+=2;
          c1[t5-1]=ch[t5-1]+ch[t6-1];
          c1[t6-1]=ch[t5]-ch[t6];
          c1[t5]=ch[t5]+ch[t6];
          c1[t6]=ch[t6-1]-ch[t5-1];
        }
        t3+=ido;
        t4+=ido;
      }
    }
  }

L119:
  for(ik=0;ik<idl1;ik++)c2[ik]=ch2[ik];

  t1=0;
  t2=ipp2*idl1;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1-ido;
    t4=t2-ido;
    for(k=0;k<l1;k++){
      t3+=ido;
      t4+=ido;
      c1[t3]=ch[t3]+ch[t4];
      c1[t4]=ch[t4]-ch[t3];
    }
  }

  ar1=1.f;
  ai1=0.f;
  t1=0;
  t2=ipp2*idl1;
  t3=(ip-1)*idl1;
  for(l=1;l<ipph;l++){
    t1+=idl1;
    t2-=idl1;
    ar1h=dcp*ar1-dsp*ai1;
    ai1=dcp*ai1+dsp*ar1;
    ar1=ar1h;
    t4=t1;
    t5=t2;
    t6=t3;
    t7=idl1;

    for(ik=0;ik<idl1;ik++){
      ch2[t4++]=c2[ik]+ar1*c2[t7++];
      ch2[t5++]=ai1*c2[t6++];
    }

    dc2=ar1;
    ds2=ai1;
    ar2=ar1;
    ai2=ai1;

    t4=idl1;
    t5=(ipp2-1)*idl1;
    for(j=2;j<ipph;j++){
      t4+=idl1;
      t5-=idl1;

      ar2h=dc2*ar2-ds2*ai2;
      ai2=dc2*ai2+ds2*ar2;
      ar2=ar2h;

      t6=t1;
      t7=t2;
      t8=t4;
      t9=t5;
      for(ik=0;ik<idl1;ik++){
        ch2[t6++]+=ar2*c2[t8++];
        ch2[t7++]+=ai2*c2[t9++];
      }
    }
  }

  t1=0;
  for(j=1;j<ipph;j++){
    t1+=idl1;
    t2=t1;
    for(ik=0;ik<idl1;ik++)ch2[ik]+=c2[t2++];
  }

  if(ido<l1)goto L132;

  t1=0;
  t2=0;
  for(k=0;k<l1;k++){
    t3=t1;
    t4=t2;
    for(i=0;i<ido;i++)cc[t4++]=ch[t3++];
    t1+=ido;
    t2+=t10;
  }

  goto L135;

 L132:
  for(i=0;i<ido;i++){
    t1=i;
    t2=i;
    for(k=0;k<l1;k++){
      cc[t2]=ch[t1];
      t1+=ido;
      t2+=t10;
    }
  }

 L135:
  t1=0;
  t2=ido<<1;
  t3=0;
  t4=ipp2*t0;
  for(j=1;j<ipph;j++){

    t1+=t2;
    t3+=t0;
    t4-=t0;

    t5=t1;
    t6=t3;
    t7=t4;

    for(k=0;k<l1;k++){
      cc[t5-1]=ch[t6];
      cc[t5]=ch[t7];
      t5+=t10;
      t6+=ido;
      t7+=ido;
    }
  }

  if(ido==1)return;
  if(nbd<l1)goto L141;

  t1=-ido;
  t3=0;
  t4=0;
  t5=ipp2*t0;
  for(j=1;j<ipph;j++){
    t1+=t2;
    t3+=t2;
    t4+=t0;
    t5-=t0;
    t6=t1;
    t7=t3;
    t8=t4;
    t9=t5;
    for(k=0;k<l1;k++){
      for(i=2;i<ido;i+=2){
        ic=idp2-i;
        cc[i+t7-1]=ch[i+t8-1]+ch[i+t9-1];
        cc[ic+t6-1]=ch[i+t8-1]-ch[i+t9-1];
        cc[i+t7]=ch[i+t8]+ch[i+t9];
        cc[ic+t6]=ch[i+t9]-ch[i+t8];
      }
      t6+=t10;
      t7+=t10;
      t8+=ido;
      t9+=ido;
    }
  }
  return;

 L141:

  t1=-ido;
  t3=0;
  t4=0;
  t5=ipp2*t0;
  for(j=1;j<ipph;j++){
    t1+=t2;
    t3+=t2;
    t4+=t0;
    t5-=t0;
    for(i=2;i<ido;i+=2){
      t6=idp2+t1-i;
      t7=i+t3;
      t8=i+t4;
      t9=i+t5;
      for(k=0;k<l1;k++){
        cc[t7-1]=ch[t8-1]+ch[t9-1];
        cc[t6-1]=ch[t8-1]-ch[t9-1];
        cc[t7]=ch[t8]+ch[t9];
        cc[t6]=ch[t9]-ch[t8];
        t6+=t10;
        t7+=t10;
        t8+=ido;
        t9+=ido;
      }
    }
  }
}